

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# index_tree.cc
# Opt level: O2

int __thiscall IndexTree::balance(IndexTree *this,int32_t *root)

{
  Node *pNVar1;
  int iVar2;
  int iVar3;
  int iStack_10;
  
  iVar2 = *root;
  pNVar1 = this->nodes;
  if (pNVar1[iVar2].balance_factor < -1) {
    if (pNVar1[pNVar1[iVar2].left].balance_factor != 1) {
      iStack_10 = 1;
LAB_00104b66:
      iVar2 = rotateOnce(this,root,iStack_10);
      return iVar2;
    }
    rotateTwice(this,root,-1);
    iVar3 = 1;
  }
  else {
    iVar3 = 0;
    if (1 < pNVar1[iVar2].balance_factor) {
      if (pNVar1[pNVar1[iVar2].right].balance_factor != -1) {
        iStack_10 = -1;
        goto LAB_00104b66;
      }
      iVar3 = 1;
      rotateTwice(this,root,1);
    }
  }
  return iVar3;
}

Assistant:

int IndexTree::balance(int32_t &root) {
    int height_change = 0;
    auto &_root = nodes[root];
    if (_root.balance_factor < -1) {
        // left unbalanced, need right rotation
        if (nodes[_root.left].balance_factor == 1) {
            // LR rotation
            height_change = rotateTwice(root, -1);
        } else {
            // R rotation
            height_change = rotateOnce(root, 1);
        }
    } else if (_root.balance_factor > 1) {
        // right unbalanced, need left rotation
        if (nodes[_root.right].balance_factor == -1) {
            // RL rotation
            height_change = rotateTwice(root, 1);
        } else {
            // L rotation
            height_change = rotateOnce(root, -1);
        }
    }

    return height_change;
}